

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::CaseAssertionExpr::fromSyntax(CasePropertyExprSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  PropertyCaseItemSyntax *pPVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  ExpressionSyntax *syntax_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CaseAssertionExpr *pCVar4;
  pointer ppPVar5;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *pEVar6;
  ItemGroup *ctx;
  Expression *ctx_00;
  iterator __begin4;
  AssertionExpr *defCase;
  SmallVector<const_slang::ast::Expression_*,_5UL> exprs;
  SmallVector<slang::ast::CaseAssertionExpr::ItemGroup,_4UL> items;
  AssertionExpr *local_138;
  ItemGroup local_130;
  AssertionExpr *local_118;
  Expression *local_110;
  pointer local_108;
  AssertionExpr *local_100;
  pointer local_f8;
  Expression *local_f0;
  undefined1 local_e8 [64];
  SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> local_a8 [2];
  
  this = ((context->scope).ptr)->compilation;
  local_138 = (AssertionExpr *)0x0;
  local_110 = bindExpr((syntax->expr).ptr,context,false,false);
  local_118 = (AssertionExpr *)0x0;
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  ppPVar5 = (syntax->items).
            super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>._M_ptr;
  local_f8 = ppPVar5 + (syntax->items).
                       super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.
                       _M_extent._M_extent_value;
  pEVar6 = extraout_RDX;
  for (; ppPVar5 != local_f8; ppPVar5 = ppPVar5 + 1) {
    pPVar1 = *ppPVar5;
    if ((pPVar1->super_SyntaxNode).kind == StandardPropertyCaseItem) {
      local_108 = ppPVar5;
      iVar3 = AssertionExpr::bind(*(AssertionExpr **)&pPVar1[4].super_SyntaxNode,(int)context,
                                  (sockaddr *)0x0,0);
      local_100 = (AssertionExpr *)CONCAT44(extraout_var,iVar3);
      local_e8._0_8_ = local_e8 + 0x18;
      local_e8._8_8_ = 0;
      local_e8._16_8_ = 5;
      local_130.expressions._M_extent._M_extent_value = 0;
      lVar2 = *(long *)&pPVar1[3].super_SyntaxNode;
      pEVar6 = extraout_RDX_00;
      local_130.expressions._M_ptr = (pointer)(pPVar1 + 1);
      for (; ((PropertyCaseItemSyntax *)local_130.expressions._M_ptr != pPVar1 + 1 ||
             (local_130.expressions._M_extent._M_extent_value != lVar2 + 1U >> 1));
          local_130.expressions._M_extent._M_extent_value =
               local_130.expressions._M_extent._M_extent_value + 1) {
        syntax_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                    iterator_base<slang::syntax::ExpressionSyntax_*>::dereference
                              ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&local_130);
        local_f0 = bindExpr(syntax_00,context,false,false);
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_e8,&local_f0);
        pEVar6 = extraout_RDX_01;
      }
      iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)local_e8,
                         (EVP_PKEY_CTX *)this,pEVar6);
      local_130.expressions._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar3);
      local_130.body.ptr = local_100;
      ctx = &local_130;
      SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::
      emplace_back<slang::ast::CaseAssertionExpr::ItemGroup>(local_a8,&local_130);
      SmallVectorBase<const_slang::ast::Expression_*>::cleanup
                ((SmallVectorBase<const_slang::ast::Expression_*> *)local_e8,(EVP_PKEY_CTX *)ctx);
      ppPVar5 = local_108;
      pEVar6 = extraout_RDX_03;
    }
    else if (local_138 == (AssertionExpr *)0x0) {
      iVar3 = AssertionExpr::bind((AssertionExpr *)pPVar1[2].super_SyntaxNode.parent,(int)context,
                                  (sockaddr *)0x0,0);
      local_138 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar3);
      pEVar6 = extraout_RDX_02;
      local_118 = local_138;
    }
  }
  iVar3 = SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::copy
                    (local_a8,(EVP_PKEY_CTX *)this,pEVar6);
  local_e8._0_8_ = CONCAT44(extraout_var_02,iVar3);
  ctx_00 = local_110;
  pCVar4 = BumpAllocator::
           emplace<slang::ast::CaseAssertionExpr,slang::ast::Expression_const&,std::span<slang::ast::CaseAssertionExpr::ItemGroup,18446744073709551615ul>,slang::ast::AssertionExpr_const*&>
                     (&this->super_BumpAllocator,local_110,
                      (span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)
                      local_e8,&local_118);
  SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::cleanup
            (local_a8,(EVP_PKEY_CTX *)ctx_00);
  return &pCVar4->super_AssertionExpr;
}

Assistant:

AssertionExpr& CaseAssertionExpr::fromSyntax(const CasePropertyExprSyntax& syntax,
                                             const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = bindExpr(*syntax.expr, context, /* allowInstances */ false, /* isBoolean */ false);

    const AssertionExpr* defCase = nullptr;
    SmallVector<ItemGroup, 4> items;
    for (auto item : syntax.items) {
        if (item->kind == SyntaxKind::StandardPropertyCaseItem) {
            auto& sci = item->as<StandardPropertyCaseItemSyntax>();
            auto& body = AssertionExpr::bind(*sci.expr, context);

            SmallVector<const Expression*> exprs;
            for (auto es : sci.expressions) {
                exprs.push_back(
                    &bindExpr(*es, context, /* allowInstances */ false, /* isBoolean */ false));
            }

            items.push_back(ItemGroup{exprs.copy(comp), &body});
        }
        else {
            // The parser already errored for duplicate defaults,
            // so just ignore if it happens here.
            if (!defCase) {
                defCase = &AssertionExpr::bind(*item->as<DefaultPropertyCaseItemSyntax>().expr,
                                               context);
            }
        }
    }

    return *comp.emplace<CaseAssertionExpr>(expr, items.copy(comp), defCase);
}